

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O2

void __thiscall
ki::protocol::dml::MessageTemplate::MessageTemplate
          (MessageTemplate *this,string *name,uint8_t type,uint8_t service_id,Record *record)

{
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  this->m_type = type;
  this->m_service_id = service_id;
  this->m_record = record;
  return;
}

Assistant:

MessageTemplate::MessageTemplate(std::string name, uint8_t type,
		uint8_t service_id, ki::dml::Record* record)
	{
		m_name = name;
		m_type = type;
		m_service_id = service_id;
		m_record = record;
	}